

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitAssignment(ParseNode *asgnNode,ParseNode *lhs,RegSlot rhsLocation,
                   ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  OpCode OVar1;
  byte bVar2;
  Symbol *sym;
  code *pcVar3;
  bool bVar4;
  OpCode OVar5;
  PropertyId propertySlot;
  uint uVar6;
  RegSlot RVar7;
  ParseNodeVar *pPVar8;
  undefined4 *puVar9;
  ParseNodeName *pPVar10;
  ParseNodeBin *pPVar11;
  ParseNodeSuperReference *pPVar12;
  
  OVar1 = lhs->nop;
  if (OVar1 - 0x51 < 3) {
    pPVar8 = ParseNode::AsParseNodeVar(lhs);
    sym = pPVar8->sym;
    if (sym == (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1c31,"(sym != nullptr)","sym != nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    ByteCodeGenerator::EmitPropStore
              (byteCodeGenerator,rhsLocation,sym,(IdentPtr)0x0,funcInfo,lhs->nop == knopLetDecl,
               lhs->nop == knopConstDecl,false,false);
    goto LAB_00767369;
  }
  if (1 < OVar1 - 0x19) {
    if (OVar1 == knopName) {
      pPVar10 = ParseNode::AsParseNodeName(lhs);
      if (pPVar10->isSpecialName != true) {
        ByteCodeGenerator::EmitPropStore
                  (byteCodeGenerator,rhsLocation,pPVar10->sym,pPVar10->pid,funcInfo,false,false,
                   false,false);
        goto LAB_00767369;
      }
    }
    else {
      if (OVar1 == knopDot) {
        pPVar11 = ParseNode::AsParseNodeBin(lhs);
        pPVar10 = ParseNode::AsParseNodeName(pPVar11->pnode2);
        propertySlot = ParseNodeName::PropertyIdFromNameNode(pPVar10);
        pPVar11 = ParseNode::AsParseNodeBin(lhs);
        bVar4 = ByteCodeGenerator::IsSuper(pPVar11->pnode1);
        if (bVar4) {
          pPVar12 = ParseNode::AsParseNodeSuperReference(lhs);
          Emit((ParseNode *)pPVar12->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
          pPVar11 = ParseNode::AsParseNodeBin(lhs);
          RVar7 = ByteCodeGenerator::EmitLdObjProto
                            (byteCodeGenerator,LdHomeObjProto,pPVar11->pnode1->location,funcInfo);
          pPVar12 = ParseNode::AsParseNodeSuperReference(lhs);
          FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar12->pnodeThis);
          uVar6 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar7,propertySlot,false,true);
          bVar2 = (funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46;
          pPVar12 = ParseNode::AsParseNodeSuperReference(lhs);
          Js::ByteCodeWriter::PatchablePropertyWithThisPtr
                    (&byteCodeGenerator->m_writer,(bVar2 & 1) * 2 + StSuperFld,rhsLocation,RVar7,
                     (pPVar12->pnodeThis->super_ParseNodeName).super_ParseNode.location,uVar6,false,
                     true);
        }
        else {
          pPVar11 = ParseNode::AsParseNodeBin(lhs);
          uVar6 = FuncInfo::FindOrAddInlineCacheId
                            (funcInfo,pPVar11->pnode1->location,propertySlot,false,true);
          OVar5 = ByteCodeGenerator::GetStFldOpCode
                            (funcInfo,false,false,false,false,
                             byteCodeGenerator->forceStrictModeForClassComputedPropertyName);
          pPVar11 = ParseNode::AsParseNodeBin(lhs);
          Js::ByteCodeWriter::PatchableProperty
                    (&byteCodeGenerator->m_writer,OVar5,rhsLocation,pPVar11->pnode1->location,uVar6,
                     false,true);
        }
        goto LAB_00767369;
      }
      if (OVar1 == knopIndex) {
        pPVar11 = ParseNode::AsParseNodeBin(lhs);
        RVar7 = pPVar11->pnode1->location;
        pPVar11 = ParseNode::AsParseNodeBin(lhs);
        bVar4 = ByteCodeGenerator::IsSuper(pPVar11->pnode1);
        if (bVar4) {
          pPVar12 = ParseNode::AsParseNodeSuperReference(lhs);
          Emit((ParseNode *)pPVar12->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
          pPVar12 = ParseNode::AsParseNodeSuperReference(lhs);
          FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar12->pnodeThis);
          RVar7 = ByteCodeGenerator::EmitLdObjProto(byteCodeGenerator,LdHomeObjProto,RVar7,funcInfo)
          ;
        }
        OVar5 = ByteCodeGenerator::GetStElemIOpCode(funcInfo);
        pPVar11 = ParseNode::AsParseNodeBin(lhs);
        Js::ByteCodeWriter::Element
                  (&byteCodeGenerator->m_writer,OVar5,rhsLocation,RVar7,pPVar11->pnode2->location,
                   false,false);
        goto LAB_00767369;
      }
      if (OVar1 == knopObjectPattern) {
        if (asgnNode != (ParseNode *)0x0) {
          Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,asgnNode->location,rhsLocation)
          ;
        }
        EmitDestructuredObject(lhs,rhsLocation,byteCodeGenerator,funcInfo);
        return;
      }
      if (OVar1 == knopArrayPattern) {
        if (asgnNode != (ParseNode *)0x0) {
          Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,asgnNode->location,rhsLocation)
          ;
        }
        EmitDestructuredArray(lhs,rhsLocation,byteCodeGenerator,funcInfo);
        return;
      }
    }
  }
  Js::ByteCodeWriter::W1(&byteCodeGenerator->m_writer,RuntimeReferenceError,0x1390);
LAB_00767369:
  if ((asgnNode != (ParseNode *)0x0) && (asgnNode->location != rhsLocation)) {
    Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,asgnNode->location,rhsLocation);
    return;
  }
  return;
}

Assistant:

void EmitAssignment(
    ParseNode *asgnNode,
    ParseNode *lhs,
    Js::RegSlot rhsLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    switch (lhs->nop)
    {
        // assignment to a local or global variable
    case knopVarDecl:
    case knopLetDecl:
    case knopConstDecl:
    {
        Symbol *sym = lhs->AsParseNodeVar()->sym;
        Assert(sym != nullptr);
        byteCodeGenerator->EmitPropStore(rhsLocation, sym, nullptr, funcInfo, lhs->nop == knopLetDecl, lhs->nop == knopConstDecl);
        break;
    }

    case knopName:
    {
        // Special names like 'this' or 'new.target' cannot be assigned to
        ParseNodeName * pnodeNameLhs = lhs->AsParseNodeName();
        if (pnodeNameLhs->IsSpecialName())
        {
            byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_CantAssignTo));
        }
        else
        {
            byteCodeGenerator->EmitPropStore(rhsLocation, pnodeNameLhs->sym, pnodeNameLhs->pid, funcInfo);
        }
        break;
    }

    // x.y =
    case knopDot:
    {
        // PutValue(x, "y", rhs)
        Js::PropertyId propertyId = lhs->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode();

        if (ByteCodeGenerator::IsSuper(lhs->AsParseNodeBin()->pnode1))
        {
            Emit(lhs->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            Js::RegSlot tmpReg = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, lhs->AsParseNodeBin()->pnode1->location, funcInfo);
            funcInfo->ReleaseLoc(lhs->AsParseNodeSuperReference()->pnodeThis);
            uint cacheId = funcInfo->FindOrAddInlineCacheId(tmpReg, propertyId, false, true);
            Js::OpCode stFldOpCode = funcInfo->GetIsStrictMode() ? Js::OpCode::StSuperFldStrict : Js::OpCode::StSuperFld;
            byteCodeGenerator->Writer()->PatchablePropertyWithThisPtr(stFldOpCode, rhsLocation, tmpReg, lhs->AsParseNodeSuperReference()->pnodeThis->location, cacheId);
        }
        else
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(lhs->AsParseNodeBin()->pnode1->location, propertyId, false, true);
            byteCodeGenerator->Writer()->PatchableProperty(
                ByteCodeGenerator::GetStFldOpCode(funcInfo, false, false, false, false, byteCodeGenerator->forceStrictModeForClassComputedPropertyName), rhsLocation, lhs->AsParseNodeBin()->pnode1->location, cacheId);
        }

        break;
    }

    case knopIndex:
    {
        Js::RegSlot targetLocation = lhs->AsParseNodeBin()->pnode1->location;

        if (ByteCodeGenerator::IsSuper(lhs->AsParseNodeBin()->pnode1))
        {
            // We need to emit the 'this' node for the super reference even if we aren't planning to use the 'this' value.
            // This is because we might be in a derived class constructor where we haven't yet called super() to bind the 'this' value.
            // See ecma262 abstract operation 'MakeSuperPropertyReference'
            Emit(lhs->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            funcInfo->ReleaseLoc(lhs->AsParseNodeSuperReference()->pnodeThis);
            targetLocation = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, targetLocation, funcInfo);
        }

        byteCodeGenerator->Writer()->Element(
            ByteCodeGenerator::GetStElemIOpCode(funcInfo),
            rhsLocation, targetLocation, lhs->AsParseNodeBin()->pnode2->location);

        break;
    }

    case knopObjectPattern:
    {
        // Copy the rhs value to be the result of the assignment if needed.
        if (asgnNode != nullptr)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, asgnNode->location, rhsLocation);
        }
        return EmitDestructuredObject(lhs, rhsLocation, byteCodeGenerator, funcInfo);
    }

    case knopArrayPattern:
    {
        // Copy the rhs value to be the result of the assignment if needed.
        if (asgnNode != nullptr)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, asgnNode->location, rhsLocation);
        }
        return EmitDestructuredArray(lhs, rhsLocation, byteCodeGenerator, funcInfo);
    }

    case knopArray:
    case knopObject:
        // Assignment to array/object can get through to byte code gen when the parser fails to convert destructuring
        // assignment to pattern (because of structural mismatch between LHS & RHS?). Revisit when we nail
        // down early vs. runtime errors for destructuring.
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_CantAssignTo));
        break;

    default:
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_CantAssignTo));
        break;
    }

    if (asgnNode != nullptr)
    {
        // We leave it up to the caller to pass this node only if the assignment expression is used.
        if (asgnNode->location != rhsLocation)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, asgnNode->location, rhsLocation);
        }
    }
}